

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  Context *pCVar1;
  uint uVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  OneofDescriptor *pOVar7;
  OneofGeneratorInfo *pOVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  FieldDescriptor *pFVar11;
  ImmutableFieldGenerator *pIVar12;
  string *value;
  int __c;
  int i_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  ulong uVar13;
  ulong extraout_RDX;
  int local_1ec;
  undefined1 local_1e8 [4];
  int i_3;
  uint local_1c4;
  int local_1c0;
  int i_2;
  int totalInts;
  int i_1;
  int totalBits;
  string local_190;
  allocator local_169;
  key_type local_168;
  allocator local_141;
  key_type local_140;
  uint local_11c;
  undefined1 local_118 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_c8;
  string local_a8;
  string local_88;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  WriteMessageDocComment(printer,this->descriptor_);
  iVar5 = Descriptor::extension_range_count(this->descriptor_);
  pPVar3 = local_18;
  if (iVar5 < 1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_a8,this->name_resolver_,this->descriptor_);
    ExtraBuilderInterfaces_abi_cxx11_(&local_c8,(java *)this->descriptor_,descriptor_00);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::Print(pPVar3,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",&local_a8,"extra_interfaces",&local_c8,"ver",
                       (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_38,this->name_resolver_,this->descriptor_);
    ExtraBuilderInterfaces_abi_cxx11_(&local_58,(java *)this->descriptor_,descriptor);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::Print(pPVar3,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",&local_38,"extra_interfaces",&local_58,"ver",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  io::Printer::Indent(local_18);
  GenerateDescriptorMethods(this,local_18);
  GenerateCommonBuilderMethods(this,local_18);
  bVar4 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar4) {
    GenerateIsInitialized(this,local_18);
    GenerateBuilderParsingMethods(this,local_18);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_118);
  for (local_11c = 0; uVar2 = local_11c, iVar5 = Descriptor::oneof_decl_count(this->descriptor_),
      (int)uVar2 < iVar5; local_11c = local_11c + 1) {
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_11c);
    pOVar8 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"oneof_name",&local_141);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_118,&local_140);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)pOVar8);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    pCVar1 = this->context_;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_11c);
    pOVar8 = Context::GetOneofGeneratorInfo(pCVar1,pOVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"oneof_capitalized_name",&local_169);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_118,&local_168);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&pOVar8->capitalized_name);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    pcVar10 = (char *)(ulong)local_11c;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_11c);
    pcVar10 = OneofDescriptor::index(pOVar7,pcVar10,__c);
    SimpleItoa_abi_cxx11_(&local_190,(protobuf *)((ulong)pcVar10 & 0xffffffff),i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&totalBits,"oneof_index",(allocator *)((long)&i_1 + 3));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_118,(key_type *)&totalBits);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_190);
    std::__cxx11::string::~string((string *)&totalBits);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
    std::__cxx11::string::~string((string *)&local_190);
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_118,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_118,
                       "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                      );
    io::Printer::Print(local_18,"  onChanged();\n");
    io::Printer::Print(local_18,"  return this;\n}\n\n");
  }
  bVar4 = anon_unknown_7::GenerateHasBits(this->descriptor_);
  if (bVar4) {
    totalInts = 0;
    for (i_2 = 0; iVar5 = i_2, iVar6 = Descriptor::field_count(this->descriptor_), iVar5 < iVar6;
        i_2 = i_2 + 1) {
      pFVar11 = Descriptor::field(this->descriptor_,i_2);
      pIVar12 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (&this->field_generators_,pFVar11);
      iVar5 = (*pIVar12->_vptr_ImmutableFieldGenerator[3])();
      totalInts = iVar5 + totalInts;
    }
    local_1c0 = (totalInts + 0x1f) / 0x20;
    uVar13 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
    for (local_1c4 = 0; pPVar3 = local_18, (int)local_1c4 < local_1c0; local_1c4 = local_1c4 + 1) {
      GetBitFieldName_abi_cxx11_((string *)local_1e8,(java *)(ulong)local_1c4,(int)uVar13);
      io::Printer::Print(pPVar3,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      uVar13 = extraout_RDX;
    }
  }
  for (local_1ec = 0; iVar5 = Descriptor::field_count(this->descriptor_), local_1ec < iVar5;
      local_1ec = local_1ec + 1) {
    io::Printer::Print(local_18,"\n");
    pFVar11 = Descriptor::field(this->descriptor_,local_1ec);
    pIVar12 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar11);
    (*pIVar12->_vptr_ImmutableFieldGenerator[6])(pIVar12,local_18);
  }
  bVar4 = PreserveUnknownFields(this->descriptor_);
  if (bVar4) {
    io::Printer::Print(local_18,
                       "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
                      );
  }
  else {
    io::Printer::Print(local_18,
                       "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\n"
                      );
  }
  pPVar3 = local_18;
  value = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar3,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n","full_name"
                     ,value);
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_118);
  return;
}

Assistant:

void MessageBuilderGenerator::
Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "    get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "public Builder clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForBuilder();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  if (!PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n");
  } else {
    // Override methods declared in GeneratedMessage to return the concrete
    // generated type so callsites won't depend on GeneratedMessage. This
    // is needed to keep binary compatibility when we change generated code
    // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
    // we changed all generated code to subclass GeneratedMessageV3).
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}